

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O2

pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_bool>
 __thiscall
llvm::
StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
::try_emplace<>(StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                *this,StringRef Key)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>
  *pSVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_bool>
  pVar6;
  StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
  local_30;
  
  uVar2 = StringMapImpl::LookupBucketFor(&this->super_StringMapImpl,Key);
  local_30.Ptr = (this->super_StringMapImpl).TheTable + uVar2;
  if (*local_30.Ptr == (StringMapEntryBase *)0xfffffffffffffff8) {
    puVar1 = &(this->super_StringMapImpl).NumTombstones;
    *puVar1 = *puVar1 - 1;
  }
  else if (*local_30.Ptr != (StringMapEntryBase *)0x0) {
    StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
    ::AdvancePastEmptyBuckets(&local_30);
    uVar5 = 0;
    goto LAB_0012f62f;
  }
  pSVar4 = StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>
           ::Create<llvm::MallocAllocator>(Key,(MallocAllocator *)&this->field_0x18);
  *local_30.Ptr = &pSVar4->super_StringMapEntryBase;
  uVar3 = (this->super_StringMapImpl).NumItems + 1;
  (this->super_StringMapImpl).NumItems = uVar3;
  if ((this->super_StringMapImpl).NumBuckets < uVar3 + (this->super_StringMapImpl).NumTombstones) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<std::unique_ptr<llbuild::buildsystem::Command>>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = std::unique_ptr<llbuild::buildsystem::Command>, AllocatorTy = llvm::MallocAllocator, ArgsTy = <>]"
                 );
  }
  uVar2 = StringMapImpl::RehashTable(&this->super_StringMapImpl,uVar2);
  local_30.Ptr = (this->super_StringMapImpl).TheTable + uVar2;
  StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
  ::AdvancePastEmptyBuckets(&local_30);
  uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_0012f62f:
  pVar6._8_8_ = uVar5;
  pVar6.first.
  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
          )(StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
            )local_30.Ptr;
  return pVar6;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }